

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int urlq_uparse(char *url,size_t sz,urlq_getopt_t *opts)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  coda_url out;
  
  coda_url::coda_url(&out);
  if ((opts->parent).val_len == 0) {
    iVar1 = coda_url::create_absolute(&out,url,sz,*(uint *)opts >> 4 & 3);
  }
  else {
    iVar1 = coda_url::create_relative(&out,url,sz,*(uint *)opts >> 4 & 3,&opts->parent);
  }
  if (iVar1 == 0) {
    pcVar2 = "";
    pcVar4 = "";
    if (out.val_len != 0) {
      pcVar2 = out.val_str;
      pcVar4 = out.dom_str;
    }
    bVar5 = (undefined1  [48])((undefined1  [48])*opts & (undefined1  [48])0x8) ==
            (undefined1  [48])0x0;
    if (bVar5) {
      pcVar4 = "";
    }
    pcVar3 = "|";
    if (bVar5) {
      pcVar3 = "";
    }
    iVar1 = 0;
    printf("%s%s%s\n",pcVar4,pcVar3,pcVar2);
  }
  else {
    iVar1 = -1;
  }
  coda_url::~coda_url(&out);
  return iVar1;
}

Assistant:

int urlq_uparse(const char *url, size_t sz, const urlq_getopt_t *opts)
{
    int rc;
    coda_url out;

    if (opts->parent.empty())
    {
        rc = out.create_absolute(url, sz, opts->uflags);
    }
    else
    {
        rc = out.create_relative(url, sz, opts->uflags, opts->parent);
    }

    if (0 != rc)
    {
        return -1;
    }

    printf("%s%s%s\n", opts->domain ? out.get_domain() : "",
        opts->domain ? "|" : "", out.get_url());

    return 0;
}